

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_fileio.cpp
# Opt level: O2

Result_t * __thiscall
Kumu::DirScannerEx::GetNext
          (Result_t *__return_storage_ptr__,DirScannerEx *this,string *next_item_name,
          DirectoryEntryType_t *next_item_type)

{
  byte bVar1;
  DirectoryEntryType_t DVar2;
  dirent *pdVar3;
  undefined1 *rhs;
  
  if ((DIR *)this->m_Handle == (DIR *)0x0) {
    rhs = RESULT_FILEOPEN;
  }
  else {
    pdVar3 = readdir((DIR *)this->m_Handle);
    if (pdVar3 == (dirent *)0x0) {
      rhs = RESULT_ENDOFFILE;
    }
    else {
      strlen(pdVar3->d_name);
      std::__cxx11::string::assign((char *)next_item_name,(ulong)pdVar3->d_name);
      bVar1 = pdVar3->d_type - 4;
      if (bVar1 < 7) {
        DVar2 = *(DirectoryEntryType_t *)(&DAT_0011c8b0 + (ulong)bVar1 * 4);
      }
      else {
        DVar2 = DET_DEV;
      }
      *next_item_type = DVar2;
      rhs = RESULT_OK;
    }
  }
  Result_t::Result_t(__return_storage_ptr__,(Result_t *)rhs);
  return __return_storage_ptr__;
}

Assistant:

Result_t
Kumu::DirScannerEx::GetNext(std::string& next_item_name, DirectoryEntryType_t& next_item_type)
{
  if ( m_Handle == 0 )
    return RESULT_FILEOPEN;

#if defined(__sun) && defined(__SVR4)
  struct stat s;
#endif
  struct dirent* entry;

  for (;;)
    {
      if ( ( entry = readdir(m_Handle) ) == 0 )
	return RESULT_ENDOFFILE;

      break;
    }

  next_item_name.assign(entry->d_name, strlen(entry->d_name));

#if defined(__sun) && defined(__SVR4)

  stat(entry->d_name, &s);

  switch ( s.st_mode )
    {
    case S_IFDIR:
      next_item_type = DET_DIR;
      break;

    case S_IFREG:
      next_item_type = DET_FILE;
      break;

    case S_IFLNK:
      next_item_type = DET_LINK;
      break;

    default:
      next_item_type = DET_DEV;
    }
#else // __sun 
  switch ( entry->d_type )
    {
    case DT_DIR:
      next_item_type = DET_DIR;
      break;

    case DT_REG:
      next_item_type = DET_FILE;
      break;

    case DT_LNK:
      next_item_type = DET_LINK;
      break;

    default:
      next_item_type = DET_DEV;
    }
#endif // __sun
  return RESULT_OK;
}